

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall fasttext::Matrix::addRow(Matrix *this,Vector *vec,int64_t i,real a)

{
  undefined1 auVar1 [16];
  pointer pfVar2;
  real *prVar3;
  reference pvVar4;
  long in_RDX;
  Vector *in_RDI;
  uint in_XMM0_Da;
  int64_t j;
  real in_stack_ffffffffffffffc8;
  uint uVar5;
  long local_28;
  
  if (in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                  ,0x33,"void fasttext::Matrix::addRow(const Vector &, int64_t, real)");
  }
  if (in_RDX < (long)in_RDI[1].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start) {
    pfVar2 = (pointer)Vector::size((Vector *)0x176ea7);
    if (pfVar2 == in_RDI[1].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      for (local_28 = 0;
          local_28 <
          (long)in_RDI[1].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish; local_28 = local_28 + 1) {
        uVar5 = in_XMM0_Da;
        prVar3 = Vector::operator[](in_RDI,CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8));
        in_stack_ffffffffffffffc8 = *prVar3;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&in_RDI->data_,
                            in_RDX * (long)in_RDI[1].data_.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_finish + local_28);
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffffc8),ZEXT416(uVar5),
                                 ZEXT416((uint)*pvVar4));
        *pvVar4 = auVar1._0_4_;
      }
      return;
    }
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                  ,0x35,"void fasttext::Matrix::addRow(const Vector &, int64_t, real)");
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                ,0x34,"void fasttext::Matrix::addRow(const Vector &, int64_t, real)");
}

Assistant:

void Matrix::addRow(const Vector& vec, int64_t i, real a) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  for (int64_t j = 0; j < n_; j++) {
    data_[i * n_ + j] += a * vec[j];
  }
}